

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash128crc.cpp
# Opt level: O0

void metrohash128crc_2(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  uint64_t uVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  long *in_RCX;
  uint in_EDX;
  ulong in_RSI;
  void *in_RDI;
  uint64_t v [4];
  uint8_t *end;
  uint8_t *ptr;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  void *local_98;
  
  local_c8 = ((ulong)in_EDX - 0xee783e2f) * 0x2e4b2e1b + in_RSI;
  local_c0 = ((ulong)in_EDX + 0xad07c493) * 0x797a90bb + in_RSI;
  local_98 = in_RDI;
  if (0x1f < in_RSI) {
    local_b8 = ((ulong)in_EDX + 0xee783e2f) * 0x797a90bb + in_RSI;
    local_b0 = ((ulong)in_EDX - 0xad07c493) * 0x2e4b2e1b + in_RSI;
    do {
      uVar1 = read_u64(local_98);
      uVar2 = crc32(local_c8,uVar1);
      local_c8 = uVar2 ^ local_c8;
      uVar1 = read_u64((void *)((long)local_98 + 8));
      uVar2 = crc32(local_c0,uVar1);
      local_c0 = uVar2 ^ local_c0;
      uVar1 = read_u64((void *)((long)local_98 + 0x10));
      uVar2 = crc32(local_b8,uVar1);
      local_b8 = uVar2 ^ local_b8;
      uVar1 = read_u64((void *)((long)local_98 + 0x18));
      uVar2 = crc32(local_b0,uVar1);
      local_b0 = uVar2 ^ local_b0;
      local_98 = (void *)((long)local_98 + 0x20);
    } while (local_98 <= (void *)((long)in_RDI + (in_RSI - 0x20)));
    uVar1 = rotate_right((local_c8 + local_b0) * 0xee783e2f + local_c0,0xc);
    local_b8 = uVar1 * 0xad07c493 ^ local_b8;
    uVar1 = rotate_right((local_c0 + local_b8) * 0xad07c493 + local_c8,0x13);
    local_b0 = uVar1 * 0xee783e2f ^ local_b0;
    uVar1 = rotate_right((local_c8 + local_b8) * 0xee783e2f + local_b0,0xc);
    local_c8 = uVar1 * 0xad07c493 ^ local_c8;
    uVar1 = rotate_right((local_c0 + local_b0) * 0xad07c493 + local_b8,0x13);
    local_c0 = uVar1 * 0xee783e2f ^ local_c0;
  }
  if (0xf < (long)((long)in_RDI + (in_RSI - (long)local_98))) {
    uVar1 = read_u64(local_98);
    uVar1 = rotate_right(uVar1 * 0x797a90bb + local_c8,0x29);
    uVar3 = read_u64((void *)((long)local_98 + 8));
    local_98 = (void *)((long)local_98 + 0x10);
    uVar3 = rotate_right(uVar3 * 0x797a90bb + local_c0,0x29);
    uVar4 = rotate_right(uVar1 * 0x15f7b2cad6b7ddb9 + uVar3 * 0x2e4b2e1b,10);
    local_c8 = uVar4 * 0xad07c493 ^ uVar1 * 0x2e4b2e1b;
    uVar1 = rotate_right(uVar3 * 0x85f1aa5c01fb6d9 + local_c8,10);
    local_c0 = uVar1 * 0xee783e2f ^ uVar3 * 0x2e4b2e1b;
  }
  if (7 < (long)((long)in_RDI + (in_RSI - (long)local_98))) {
    uVar1 = read_u64(local_98);
    local_98 = (void *)((long)local_98 + 8);
    uVar1 = rotate_right(uVar1 * 0x797a90bb + local_c8,0x22);
    uVar3 = rotate_right(uVar1 * 0x15f7b2cad6b7ddb9 + local_c0,0x16);
    local_c8 = uVar3 * 0xad07c493 ^ uVar1 * 0x2e4b2e1b;
  }
  if (3 < (long)((long)in_RDI + (in_RSI - (long)local_98))) {
    uVar1 = read_u32(local_98);
    uVar2 = crc32(local_c8,uVar1);
    local_98 = (void *)((long)local_98 + 4);
    uVar1 = rotate_right((uVar2 ^ local_c0) * 0x2e4b2e1b + local_c8,0xe);
    local_c0 = uVar1 * 0xee783e2f ^ uVar2 ^ local_c0;
  }
  if (1 < (long)((long)in_RDI + (in_RSI - (long)local_98))) {
    uVar1 = read_u16(local_98);
    uVar2 = crc32(local_c0,uVar1);
    local_98 = (void *)((long)local_98 + 2);
    uVar1 = rotate_right((uVar2 ^ local_c8) * 0x797a90bb + local_c0,0xf);
    local_c8 = uVar1 * 0xad07c493 ^ uVar2 ^ local_c8;
  }
  if (0 < (long)((long)in_RDI + (in_RSI - (long)local_98))) {
    uVar1 = read_u8(local_98);
    uVar2 = crc32(local_c8,uVar1);
    uVar1 = rotate_right((uVar2 ^ local_c0) * 0x2e4b2e1b + local_c8,0x12);
    local_c0 = uVar1 * 0xee783e2f ^ uVar2 ^ local_c0;
  }
  uVar1 = rotate_right(local_c8 * 0xee783e2f + local_c0,0xf);
  lVar5 = uVar1 + local_c8;
  uVar1 = rotate_right(local_c0 * 0xad07c493 + lVar5,0x1b);
  lVar6 = uVar1 + local_c0;
  uVar1 = rotate_right(lVar5 * 0xee783e2f + lVar6,0xf);
  uVar3 = rotate_right(lVar6 * 0xad07c493 + uVar1 + lVar5,0x1b);
  *in_RCX = uVar1 + lVar5;
  in_RCX[1] = uVar3 + lVar6;
  return;
}

Assistant:

void metrohash128crc_2(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xEE783E2F;
    static const uint64_t k1 = 0xAD07C493;
    static const uint64_t k2 = 0x797A90BB;
    static const uint64_t k3 = 0x2E4B2E1B;

    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(key);
    const uint8_t * const end = ptr + len;
    
    uint64_t v[4];
    
    v[0] = ((static_cast<uint64_t>(seed) - k0) * k3) + len;
    v[1] = ((static_cast<uint64_t>(seed) + k1) * k2) + len;
    
    if (len >= 32)
    {        
        v[2] = ((static_cast<uint64_t>(seed) + k0) * k2) + len;
        v[3] = ((static_cast<uint64_t>(seed) - k1) * k3) + len;

        do
        {
            v[0] ^= _mm_crc32_u64(v[0], read_u64(ptr)); ptr += 8;
            v[1] ^= _mm_crc32_u64(v[1], read_u64(ptr)); ptr += 8;
            v[2] ^= _mm_crc32_u64(v[2], read_u64(ptr)); ptr += 8;
            v[3] ^= _mm_crc32_u64(v[3], read_u64(ptr)); ptr += 8;
        }
        while (ptr <= (end - 32));

        v[2] ^= rotate_right(((v[0] + v[3]) * k0) + v[1], 12) * k1;
        v[3] ^= rotate_right(((v[1] + v[2]) * k1) + v[0], 19) * k0;
        v[0] ^= rotate_right(((v[0] + v[2]) * k0) + v[3], 12) * k1;
        v[1] ^= rotate_right(((v[1] + v[3]) * k1) + v[2], 19) * k0;
    }
    
    if ((end - ptr) >= 16)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],41) * k3;
        v[1] += read_u64(ptr) * k2; ptr += 8; v[1] = rotate_right(v[1],41) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 10) * k1;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 10) * k0;
    }
    
    if ((end - ptr) >= 8)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],34) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 22) * k1;
    }
    
    if ((end - ptr) >= 4)
    {
        v[1] ^= _mm_crc32_u64(v[0], read_u32(ptr)); ptr += 4;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 14) * k0;
    }
    
    if ((end - ptr) >= 2)
    {
        v[0] ^= _mm_crc32_u64(v[1], read_u16(ptr)); ptr += 2;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 15) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
        v[1] ^= _mm_crc32_u64(v[0], read_u8 (ptr));
        v[1] ^= rotate_right((v[1] * k3) + v[0],  18) * k0;
    }
    
    v[0] += rotate_right((v[0] * k0) + v[1], 15);
    v[1] += rotate_right((v[1] * k1) + v[0], 27);
    v[0] += rotate_right((v[0] * k0) + v[1], 15);
    v[1] += rotate_right((v[1] * k1) + v[0], 27);

    memcpy(out, v, 16);
}